

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O3

int fsg_model_word_id(fsg_model_t *fsg,char *word)

{
  uint uVar1;
  char **ppcVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar1 = fsg->n_word;
  if ((int)uVar1 < 1) {
    uVar5 = 0;
  }
  else {
    ppcVar2 = fsg->vocab;
    uVar5 = 0;
    do {
      iVar3 = strcmp(ppcVar2[uVar5],word);
      if (iVar3 == 0) goto LAB_00104e2e;
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
    uVar5 = (ulong)uVar1;
  }
LAB_00104e2e:
  uVar4 = 0xffffffff;
  if ((uint)uVar5 != uVar1) {
    uVar4 = (uint)uVar5;
  }
  return uVar4;
}

Assistant:

int
fsg_model_word_id(fsg_model_t * fsg, char const *word)
{
    int wid;

    /* Search for an existing word matching this. */
    for (wid = 0; wid < fsg->n_word; ++wid) {
        if (0 == strcmp(fsg->vocab[wid], word))
            break;
    }
    /* If not found, add this to the vocab. */
    if (wid == fsg->n_word)
        return -1;
    return wid;
}